

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_export.cpp
# Opt level: O1

unique_ptr<duckdb::ExportStatement,_std::default_delete<duckdb::ExportStatement>,_true> __thiscall
duckdb::Transformer::TransformExport(Transformer *this,PGExportStmt *stmt)

{
  char *pcVar1;
  char *pcVar2;
  CopyInfo *this_00;
  pointer pCVar3;
  type info_00;
  Transformer *this_01;
  pointer pEVar4;
  long in_RDX;
  pointer *__ptr;
  templated_unique_single_t info;
  _Head_base<0UL,_duckdb::CopyInfo_*,_false> local_40;
  _Head_base<0UL,_duckdb::CopyInfo_*,_false> local_38;
  
  this_00 = (CopyInfo *)operator_new(0x110);
  CopyInfo::CopyInfo(this_00);
  pcVar1 = *(char **)(in_RDX + 0x10);
  local_40._M_head_impl = this_00;
  pCVar3 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_40);
  pcVar2 = (char *)(pCVar3->file_path)._M_string_length;
  strlen(pcVar1);
  ::std::__cxx11::string::_M_replace((ulong)&pCVar3->file_path,0,pcVar2,(ulong)pcVar1);
  pCVar3 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_40);
  ::std::__cxx11::string::_M_replace
            ((ulong)&pCVar3->format,0,(char *)(pCVar3->format)._M_string_length,0x12d4f33);
  pCVar3 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_40);
  pCVar3->is_from = false;
  info_00 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator*
                      ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                       &local_40);
  TransformCopyOptions((Transformer *)stmt,info_00,*(PGList **)(in_RDX + 0x18));
  this_01 = (Transformer *)operator_new(0xa0);
  local_38._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (CopyInfo *)0x0;
  ExportStatement::ExportStatement
            ((ExportStatement *)this_01,
             (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)&local_38)
  ;
  (this->parent).ptr = this_01;
  if (local_38._M_head_impl != (CopyInfo *)0x0) {
    (*((local_38._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  pcVar1 = *(char **)(in_RDX + 8);
  if (pcVar1 != (char *)0x0) {
    pEVar4 = unique_ptr<duckdb::ExportStatement,_std::default_delete<duckdb::ExportStatement>,_true>
             ::operator->((unique_ptr<duckdb::ExportStatement,_std::default_delete<duckdb::ExportStatement>,_true>
                           *)this);
    pcVar2 = (char *)(pEVar4->database)._M_string_length;
    strlen(pcVar1);
    ::std::__cxx11::string::_M_replace((ulong)&pEVar4->database,0,pcVar2,(ulong)pcVar1);
  }
  if (local_40._M_head_impl != (CopyInfo *)0x0) {
    (*((local_40._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  return (unique_ptr<duckdb::ExportStatement,_std::default_delete<duckdb::ExportStatement>_>)
         (unique_ptr<duckdb::ExportStatement,_std::default_delete<duckdb::ExportStatement>_>)this;
}

Assistant:

unique_ptr<ExportStatement> Transformer::TransformExport(duckdb_libpgquery::PGExportStmt &stmt) {
	auto info = make_uniq<CopyInfo>();
	info->file_path = stmt.filename;
	info->format = "csv";
	info->is_from = false;
	// handle export options
	TransformCopyOptions(*info, stmt.options);

	auto result = make_uniq<ExportStatement>(std::move(info));
	if (stmt.database) {
		result->database = stmt.database;
	}
	return result;
}